

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInternalFormatQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FormatSamplesCase::iterate(FormatSamplesCase *this)

{
  int *piVar1;
  ostringstream *poVar2;
  GLenum GVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  ulong uVar8;
  char *description;
  long lVar9;
  qpTestResult testResult;
  TestContext *this_02;
  size_type __n;
  size_t ndx;
  ulong uVar10;
  bool local_359;
  GLint numSampleCounts;
  GLint maxSamples;
  vector<int,_std::allocator<int>_> samples;
  MessageBuilder samplesMsg;
  undefined1 local_1b0 [8];
  int local_1a8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  maxSamples = 0;
  numSampleCounts = 0;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  GVar3 = this->m_internalFormat;
  if (bVar5) {
    if (((GVar3 != 0x822e) && (GVar3 != 0x8230)) && ((GVar3 != 0x881a && (GVar3 != 0x8814))))
    goto LAB_012b8cf2;
    bVar5 = true;
  }
  else {
    if ((((GVar3 - 0x822d < 4) || (GVar3 == 0x8814)) || (GVar3 == 0x8c3a)) || (GVar3 == 0x881a)) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"The internal format is not supported in a context lower than 3.2",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                 ,99);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
LAB_012b8cf2:
    bVar5 = false;
  }
  iVar6 = 0x910e;
  if (this->m_type != FORMAT_COLOR) {
    iVar6 = (this->m_type == FORMAT_INT) + 0x910f;
  }
  samplesMsg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &samplesMsg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Format must support sample count of ");
  local_1b0 = (undefined1  [8])glu::getGettableStateName;
  local_1a8 = iVar6;
  tcu::Format::Enum<int,_2UL>::toStream
            ((Enum<int,_2UL> *)local_1b0,&poVar2->super_basic_ostream<char,_std::char_traits<char>_>
            );
  tcu::MessageBuilder::operator<<(&samplesMsg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  (**(code **)(lVar9 + 0x868))(iVar6,&maxSamples);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"get MAX_*_SAMPLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0x71);
  samplesMsg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &samplesMsg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  local_1b0 = (undefined1  [8])glu::getGettableStateName;
  local_1a8 = iVar6;
  tcu::Format::Enum<int,_2UL>::toStream
            ((Enum<int,_2UL> *)local_1b0,&poVar2->super_basic_ostream<char,_std::char_traits<char>_>
            );
  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>," = ");
  std::ostream::operator<<(poVar2,maxSamples);
  tcu::MessageBuilder::operator<<(&samplesMsg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  bVar4 = maxSamples < 1;
  if (maxSamples < 1) {
    samplesMsg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &samplesMsg.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                    "ERROR: minimum value of ");
    local_1b0 = (undefined1  [8])glu::getGettableStateName;
    local_1a8 = iVar6;
    tcu::Format::Enum<int,_2UL>::toStream
              ((Enum<int,_2UL> *)local_1b0,
               &poVar2->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>," is 1");
    tcu::MessageBuilder::operator<<(&samplesMsg,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  }
  (**(code **)(lVar9 + 0x880))(this->m_target,this->m_internalFormat,0x9380,1,&numSampleCounts);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"get GL_NUM_SAMPLE_COUNTS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0x7f);
  samplesMsg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &samplesMsg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                  "GL_NUM_SAMPLE_COUNTS = ");
  std::ostream::operator<<(poVar2,numSampleCounts);
  tcu::MessageBuilder::operator<<(&samplesMsg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  local_359 = numSampleCounts < 1 && !bVar5;
  if (local_359) {
    samplesMsg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &samplesMsg.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                    "ERROR: Format MUST support some multisample configuration, got GL_NUM_SAMPLE_COUNTS = "
                   );
    std::ostream::operator<<(poVar2,numSampleCounts);
    tcu::MessageBuilder::operator<<(&samplesMsg,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  }
  local_359 = local_359 || bVar4;
  samplesMsg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &samplesMsg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  __n = 1;
  if (1 < numSampleCounts) {
    __n = (size_type)(uint)numSampleCounts;
  }
  std::vector<int,_std::allocator<int>_>::vector(&samples,__n,(allocator_type *)local_1b0);
  if ((bool)(~bVar5 & numSampleCounts < 1)) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"glGetInternalFormativ() reported 0 supported sample counts",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
               ,0x98);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar9 + 0x880))
            (this->m_target,this->m_internalFormat,0x80a9,numSampleCounts,
             samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"get GL_SAMPLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0x95);
  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,"GL_SAMPLES = [");
  lVar9 = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)((long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2); uVar10 = uVar10 + 1) {
    if (uVar10 != 0) {
      std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    }
    tcu::MessageBuilder::operator<<
              (&samplesMsg,
               (int *)((long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + 4;
  }
  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,"]");
  tcu::MessageBuilder::operator<<(&samplesMsg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uVar8 = (long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar10 = 1;
  do {
    if (uVar8 <= uVar10) goto LAB_012b90f4;
    lVar9 = uVar10 - 1;
    piVar1 = samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + uVar10;
    uVar10 = uVar10 + 1;
  } while (*piVar1 < samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9]);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,"ERROR: Samples must be ordered descending.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  uVar8 = (long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  local_359 = true;
LAB_012b90f4:
  uVar10 = 1;
  do {
    if (uVar8 <= uVar10) goto LAB_012b9151;
    lVar9 = uVar10 - 1;
    uVar10 = uVar10 + 1;
  } while (0 < samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar9]);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,"ERROR: Only positive SAMPLES allowed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  local_359 = true;
LAB_012b9151:
  if ((bVar5) ||
     (maxSamples <=
      *samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start)) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&samples.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    if (!local_359) {
      this_02 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_012b91f2;
    }
  }
  else {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"ERROR: MAX_*_SAMPLES must be supported.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&samples.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  }
  this_02 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Invalid value";
  testResult = QP_TEST_RESULT_FAIL;
LAB_012b91f2:
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

FormatSamplesCase::IterateResult FormatSamplesCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	bool					isFloatFormat	= false;
	bool					error			= false;
	glw::GLint				maxSamples		= 0;
	glw::GLint				numSampleCounts	= 0;
	const bool				supportsES32			= contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32)
	{
		if (m_internalFormat == GL_RGBA16F || m_internalFormat == GL_R32F || m_internalFormat == GL_RG32F || m_internalFormat == GL_RGBA32F || m_internalFormat == GL_R16F || m_internalFormat == GL_RG16F || m_internalFormat == GL_R11F_G11F_B10F)
		{
			TCU_THROW(NotSupportedError, "The internal format is not supported in a context lower than 3.2");
		}
	}
	else if (m_internalFormat == GL_RGBA16F || m_internalFormat == GL_R32F || m_internalFormat == GL_RG32F || m_internalFormat == GL_RGBA32F)
	{
		isFloatFormat = true;
	}

	// Lowest limit
	{
		const glw::GLenum samplesEnum = (m_type == FORMAT_COLOR) ? (GL_MAX_COLOR_TEXTURE_SAMPLES) : (m_type == FORMAT_INT) ? (GL_MAX_INTEGER_SAMPLES) : (GL_MAX_DEPTH_TEXTURE_SAMPLES);
		m_testCtx.getLog() << tcu::TestLog::Message << "Format must support sample count of " << glu::getGettableStateStr(samplesEnum) << tcu::TestLog::EndMessage;

		gl.getIntegerv(samplesEnum, &maxSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get MAX_*_SAMPLES");

		m_testCtx.getLog() << tcu::TestLog::Message << glu::getGettableStateStr(samplesEnum) << " = " << maxSamples << tcu::TestLog::EndMessage;

		if (maxSamples < 1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: minimum value of "  << glu::getGettableStateStr(samplesEnum) << " is 1" << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Number of sample counts
	{
		gl.getInternalformativ(m_target, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &numSampleCounts);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_NUM_SAMPLE_COUNTS");

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_NUM_SAMPLE_COUNTS = " << numSampleCounts << tcu::TestLog::EndMessage;

		if (!isFloatFormat)
		{
			if (numSampleCounts < 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Format MUST support some multisample configuration, got GL_NUM_SAMPLE_COUNTS = " << numSampleCounts << tcu::TestLog::EndMessage;
				error = true;
			}
		}
	}

	// Sample counts
	{
		tcu::MessageBuilder		samplesMsg	(&m_testCtx.getLog());
		std::vector<glw::GLint>	samples		(numSampleCounts > 0 ? numSampleCounts : 1);

		if (numSampleCounts > 0 || isFloatFormat)
		{
			gl.getInternalformativ(m_target, m_internalFormat, GL_SAMPLES, numSampleCounts, &samples[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_SAMPLES");
		}
		else
			TCU_FAIL("glGetInternalFormativ() reported 0 supported sample counts");

		// make a pretty log

		samplesMsg << "GL_SAMPLES = [";
		for (size_t ndx = 0; ndx < samples.size(); ++ndx)
		{
			if (ndx)
				samplesMsg << ", ";
			samplesMsg << samples[ndx];
		}
		samplesMsg << "]" << tcu::TestLog::EndMessage;

		// Samples are in order
		for (size_t ndx = 1; ndx < samples.size(); ++ndx)
		{
			if (samples[ndx-1] <= samples[ndx])
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Samples must be ordered descending." << tcu::TestLog::EndMessage;
				error = true;
				break;
			}
		}

		// samples are positive
		for (size_t ndx = 1; ndx < samples.size(); ++ndx)
		{
			if (samples[ndx-1] <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Only positive SAMPLES allowed." << tcu::TestLog::EndMessage;
				error = true;
				break;
			}
		}

		// maxSamples must be supported
		if (!isFloatFormat)
		{
			if (samples[0] < maxSamples)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: MAX_*_SAMPLES must be supported." << tcu::TestLog::EndMessage;
				error = true;
			}
		}
	}

	// Result
	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");

	return STOP;
}